

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void print_fastq_seq(kseq_t *seq)

{
  char *__s;
  char *pcVar1;
  char *pcVar2;
  undefined1 uVar3;
  uint uVar4;
  size_t sVar5;
  void *__ptr;
  ulong uVar6;
  ulong uVar7;
  
  __s = (seq->seq).s;
  sVar5 = strlen(__s);
  pcVar1 = (seq->qual).s;
  if (pcVar1 == (char *)0x0) {
    uVar4 = (int)sVar5 + 1;
    __ptr = malloc((long)(int)uVar4);
    uVar3 = (undefined1)QUALITY_SCORE;
    uVar6 = 0;
    uVar7 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      *(undefined1 *)((long)__ptr + uVar6) = uVar3;
    }
    *(undefined1 *)((long)__ptr + (long)(int)sVar5) = 0;
    pcVar1 = (seq->name).s;
    if ((seq->comment).l == 0) {
      printf("@%s\n%s\n+\n%s\n",pcVar1,__s,__ptr);
    }
    else {
      printf("@%s %s\n%s\n+\n%s\n",pcVar1,(seq->comment).s,__s,__ptr);
    }
    free(__ptr);
    return;
  }
  pcVar2 = (seq->name).s;
  if ((seq->comment).l != 0) {
    printf("@%s %s\n%s\n+\n%s\n",pcVar2,(seq->comment).s,__s);
    return;
  }
  printf("@%s\n%s\n+\n%s\n",pcVar2,__s,pcVar1);
  return;
}

Assistant:

void print_fastq_seq(kseq_t *seq)
{
	char *qual_str = NULL;
	int i=0;
	int l=strlen(seq->seq.s) + 1;     /* sequence length */
	if (seq->qual.s == NULL) {        /* just use a default value for the quality code */
		qual_str = (char *)malloc(sizeof(char) * l);
		for (i=0;i<l;i++) {
			qual_str[i] = (char)QUALITY_SCORE; /* set the value to char '=', ASCII 61 */
		}
		qual_str[l - 1] = '\0'; /* terminate the string */

		if (seq->comment.l == 0)
			printf("@%s\n%s\n+\n%s\n", seq->name.s, seq->seq.s, qual_str);
		else
			printf("@%s %s\n%s\n+\n%s\n", seq->name.s, seq->comment.s, seq->seq.s, qual_str);

		free(qual_str);
	} else {
		if (seq->comment.l == 0)
			printf("@%s\n%s\n+\n%s\n",seq->name.s,seq->seq.s,seq->qual.s);
		else
			printf("@%s %s\n%s\n+\n%s\n",seq->name.s,seq->comment.s,seq->seq.s,seq->qual.s);
	}
}